

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O1

Expr * primary_expr(void)

{
  ScriptFunc *pSVar1;
  byte bVar2;
  char cVar3;
  ushort *puVar4;
  int iVar5;
  Expr *pEVar6;
  ushort **ppuVar7;
  char *pcVar8;
  Symbol *pSVar9;
  __int32_t **pp_Var10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  int errn;
  ScriptFunc *pSVar15;
  bool bVar16;
  lword val;
  lword local_20;
  
  pcVar8 = s;
  local_20 = 0;
  bVar2 = *s;
  if ((ulong)bVar2 == 0x28) {
    s = s + 1;
    skip();
    pEVar6 = expression();
    if (*s == ')') {
      s = s + 1;
    }
    else {
      error(0x42,scriptname,(ulong)(uint)line,0x29);
    }
    skip();
    return pEVar6;
  }
  ppuVar7 = __ctype_b_loc();
  puVar4 = *ppuVar7;
  if ((*(byte *)((long)puVar4 + (ulong)bVar2 * 2 + 1) & 8) == 0) {
    pcVar8 = getarg('\x01');
    if (pcVar8 == (char *)0x0) {
      iVar5 = 0x4e;
LAB_00115676:
      error(iVar5,scriptname,(ulong)(uint)line);
LAB_0011567d:
      iVar5 = 0x15;
    }
    else {
      if ((*pcVar8 == '.') && (pcVar8[1] == '\0')) {
        iVar5 = 0x15;
        if (caddr == -2) goto LAB_0011582b;
        lVar11 = caddr;
        if (caddr == -1) {
          error(0x65,scriptname,(ulong)(uint)line);
          goto LAB_0011582b;
        }
LAB_00115802:
        iVar5 = 0x16;
        local_20 = lVar11;
        goto LAB_0011582b;
      }
      pSVar9 = findsymbol(gv,(Section *)0x0,pcVar8);
      if (pSVar9 == (Symbol *)0x0) {
        pSVar15 = ldFunctions;
        bVar16 = ldFunctions[0].name == (char *)0x0;
        if (!bVar16) {
          iVar5 = strcmp(ldFunctions[0].name,pcVar8);
          if (iVar5 != 0) {
            pSVar15 = ldFunctions;
            do {
              pSVar1 = pSVar15 + 1;
              bVar16 = pSVar1->name == (char *)0x0;
              if (bVar16) goto LAB_001156d3;
              pSVar15 = pSVar15 + 1;
              iVar5 = strcmp(pSVar1->name,pcVar8);
            } while (iVar5 != 0);
          }
          if (!bVar16) {
            if (caddr == -1) {
              iVar5 = 0x69;
              goto LAB_00115676;
            }
            if (caddr != -2) {
              iVar5 = (*pSVar15->funcptr)(gv,caddr,&local_20);
              iVar5 = (iVar5 == 0) + 0x15;
              goto LAB_0011582b;
            }
            skip();
            cVar3 = *s;
            if ((cVar3 == '\0') || (s = s + 1, cVar3 != '(')) {
              s = s + -1;
            }
            else {
              skipblock(1,'(',')');
            }
            goto LAB_0011567d;
          }
        }
LAB_001156d3:
        iVar5 = 0x15;
        if (caddr == -2) goto LAB_0011582b;
        uVar13 = (ulong)(uint)line;
        errn = 0x68;
      }
      else {
        iVar5 = 0x15;
        if (caddr == -2) goto LAB_0011582b;
        if ((caddr == -1) && (pSVar9->type != '\x01')) {
          uVar13 = (ulong)(uint)line;
          pcVar8 = pSVar9->name;
          errn = 0x66;
        }
        else {
          if (pSVar9->type == '\x02') {
            if (pSVar9->relsect->lnksec != (LinkedSection *)0x0) {
              lVar11 = pSVar9->value + pSVar9->relsect->va;
              goto LAB_00115802;
            }
          }
          else if (pSVar9->type == '\x01') {
            local_20 = pSVar9->value;
            goto LAB_0011582b;
          }
          uVar13 = (ulong)(uint)line;
          pcVar8 = pSVar9->name;
          errn = 0x6a;
        }
      }
      iVar5 = 0x15;
      error(errn,scriptname,uVar13,pcVar8);
    }
    goto LAB_0011582b;
  }
  uVar14 = 10;
  if (bVar2 == 0x30) {
    if ((byte)(pcVar8[1] | 0x20U) != 0x78) {
      uVar14 = 8;
      goto LAB_00115705;
    }
    s = pcVar8 + 2;
    uVar13 = (ulong)(byte)pcVar8[2];
    bVar2 = *(byte *)((long)puVar4 + uVar13 * 2 + 1);
    while ((bVar2 & 0x10) != 0) {
      cVar3 = (char)uVar13;
      if ((byte)(cVar3 - 0x30U) < 10) {
        local_20 = local_20 * 0x10 + uVar13 + -0x30;
      }
      else if ((byte)(cVar3 + 0x9fU) < 6) {
        local_20 = local_20 * 0x10 + uVar13 + -0x57;
      }
      else {
        local_20 = local_20 * 0x10 + (long)cVar3 + -0x37;
      }
      s = (char *)((byte *)s + 1);
      uVar13 = (ulong)(byte)*s;
      bVar2 = *(byte *)((long)puVar4 + uVar13 * 2 + 1);
    }
  }
  else {
LAB_00115705:
    bVar2 = *s;
    uVar13 = (ulong)bVar2;
    if ((int)(char)bVar2 < (int)(uVar14 | 0x30) && '/' < (char)bVar2) {
      do {
        local_20 = local_20 * (ulong)uVar14 + (uVar13 & 0xff) + -0x30;
        uVar12 = (uint)s[1];
        uVar13 = (ulong)uVar12;
        s = s + 1;
        if ((int)uVar12 < 0x30) break;
      } while ((int)uVar12 < (int)(uVar14 | 0x30));
    }
  }
  pp_Var10 = __ctype_toupper_loc();
  iVar5 = 0x15;
  if ((*pp_Var10)[(byte)*s] == 0x4d) {
    local_20 = local_20 << 0x14;
  }
  else {
    if ((*pp_Var10)[(byte)*s] != 0x4b) goto LAB_0011582b;
    local_20 = local_20 << 10;
  }
  s = s + 1;
LAB_0011582b:
  skip();
  pEVar6 = (Expr *)alloc(0x20);
  pEVar6->left = (Expr *)0x0;
  pEVar6->right = (Expr *)0x0;
  pEVar6->type = iVar5;
  pEVar6->val = local_20;
  return pEVar6;
}

Assistant:

static struct Expr *primary_expr(void)
{
  lword val = 0;
  int type = ABS;
  struct Expr *new;

  if (*s == '(') {
    s++;
    skip();
    new = expression();
    if (*s != ')')
      error(66,scriptname,line,')');  /* ')' expected */
    else
      s++;
    skip();
    return new;
  }

  if (isdigit((unsigned char)*s)) {
    /* octal, decimal or hex constant */
    if (s[0]=='0' && (s[1]=='x' || s[1]=='X')) {
      s += 2;
      while (isxdigit((unsigned char)*s)) {
        if (*s>='0' && *s<='9')
          val = (val<<4) + *s++ - '0';
        else if (*s>='a' && *s<='f')
          val = (val<<4) + *s++ - 'a' + 10;
        else
          val = (val<<4) + *s++ - 'A' + 10;
      }
    }
    else {
      int base = (*s=='0') ? 8 : 10;

      while (*s>='0' && *s<('0'+base)) {
        val = base*val + *s++ - '0';
      }
    }

    if (toupper((unsigned char)*s) == 'K') {
      val <<= 10;
      s++;
    }
    else if (toupper((unsigned char)*s) == 'M') {
      val <<= 20;
      s++;
    }
  }

  else {
    char *word;

    if (word = getarg(1)) {
      if (word[0]=='.' && word[1]=='\0') {  /* current address symbol '.' */
        if (caddr != -1) {
          if (caddr != -2) {
            val = caddr;
            type = REL;
          }
        }
        else {
          /* Address symbol '.' invalid outside SECTIONS block */
          error(101,scriptname,line);
        }
      }
      else {  /* otherwise it's possibly a function- or symbol-name */
        struct Symbol *sym;

        if (sym = findsymbol(gv,NULL,word)) {
          if (caddr==-1 && sym->type!=SYM_ABS) {
            /* Reference to non-absolute symbol */
            error(102,scriptname,line,sym->name);
          }
          else if (caddr != -2) {
            if (sym->type == SYM_ABS) {
              val = sym->value;
            }
            else if (sym->type==SYM_RELOC && sym->relsect->lnksec!=NULL) {
              val = (lword)sym->relsect->va + sym->value;
              type = REL;
            }
            else {
              /* Symbol is not yet assigned */
              error(106,scriptname,line,sym->name);
            }
          }
        }
        else {
          struct ScriptFunc *sfptr;

          for (sfptr=ldFunctions; sfptr->name; sfptr++) {
            if (!strcmp(sfptr->name,word))
              break;
          }
          if (sfptr->name) {
            if (caddr == -2) {
              if (getchr() == '(')
                skipblock(1,'(',')');
              else
                back(1);
            }
            else if (caddr != -1)
              type = sfptr->funcptr(gv,caddr,&val) ? ABS : REL;
            else
              error(105,scriptname,line);  /* No function-calls allowed here */
          }
          else if (caddr != -2)
            error(104,scriptname,line,word);  /* Unknown symbol or function */
        }
      }
    }
    else
      error(78,scriptname,line);   /* missing argument */
  }

  skip();
  new = new_expr();
  new->type = type;
  new->val = val;
  return new;
}